

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::CreateSafeUniqueObjectFileName(cmLocalGenerator *this,string *sin,string *dir_max)

{
  cmMakefile *this_00;
  bool bVar1;
  __type _Var2;
  iterator iVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  uint uVar6;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar8;
  string sssin;
  string ssin;
  value_type e;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->UniqueObjectNamesMap)._M_t,sin);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&ssin,(string *)sin);
    std::__cxx11::string::find_first_not_of((char)&ssin,0x2f);
    std::__cxx11::string::erase((ulong)&ssin,0);
    e.first._M_dataplus._M_p._0_1_ = 0x3a;
    sssin._M_dataplus._M_p._0_1_ = 0x5f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ssin._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(ssin._M_dataplus._M_p + ssin._M_string_length),(char *)&e,(char *)&sssin);
    cmsys::SystemTools::ReplaceString(&ssin,"../","__/");
    e.first._M_dataplus._M_p._0_1_ = 0x20;
    sssin._M_dataplus._M_p._0_1_ = 0x5f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ssin._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(ssin._M_dataplus._M_p + ssin._M_string_length),(char *)&e,(char *)&sssin);
    this_00 = this->Makefile;
    std::__cxx11::string::string((string *)&e,"CMAKE_MANGLE_OBJECT_FILE_NAMES",(allocator *)&sssin);
    bVar1 = cmMakefile::IsOn(this_00,&e.first);
    std::__cxx11::string::~string((string *)&e);
    if (bVar1) {
      e.first._M_dataplus._M_p._0_4_ = 0x5f705f;
      cmsys::SystemTools::ReplaceString(&ssin,"+",(char *)&e);
      std::__cxx11::string::string((string *)&sssin,(string *)sin);
      uVar6 = 0;
      while( true ) {
        bVar1 = true;
        for (p_Var4 = (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left; p_Var4 != iVar3._M_node;
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(p_Var4 + 2),&ssin);
          bVar1 = (bool)(bVar1 & !_Var2);
        }
        if (bVar1) break;
        std::__cxx11::string::_M_assign((string *)&sssin);
        cmsys::SystemTools::ReplaceString(&ssin,"_p_",(char *)&e);
        sprintf((char *)&e,"_p%d_",(ulong)uVar6);
        uVar6 = uVar6 + 1;
      }
      std::__cxx11::string::~string((string *)&sssin);
    }
    bVar1 = cmLocalGeneratorCheckObjectName(&ssin,dir_max->_M_string_length,this->ObjectPathMax);
    if (!bVar1) {
      pVar7 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&this->ObjectMaxPathViolations,dir_max);
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,"The object file directory\n");
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,(string *)dir_max);
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"has ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5," characters.  ");
        poVar5 = std::operator<<(poVar5,"The maximum full path to an object file is ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5," characters ");
        poVar5 = std::operator<<(poVar5,"(see CMAKE_OBJECT_PATH_MAX).  ");
        poVar5 = std::operator<<(poVar5,"Object file\n");
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,(string *)&ssin);
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"cannot be safely placed under this directory.  ");
        std::operator<<(poVar5,"The build may not work correctly.");
        std::__cxx11::stringbuf::str();
        IssueMessage(this,WARNING,&sssin);
        std::__cxx11::string::~string((string *)&sssin);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&e,sin,&ssin);
    pVar8 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&this->UniqueObjectNamesMap,&e);
    iVar3._M_node = (_Base_ptr)pVar8.first._M_node;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&e);
    std::__cxx11::string::~string((string *)&ssin);
  }
  return (string *)(iVar3._M_node + 2);
}

Assistant:

std::string& cmLocalGenerator::CreateSafeUniqueObjectFileName(
  const std::string& sin, std::string const& dir_max)
{
  // Look for an existing mapped name for this object file.
  std::map<std::string, std::string>::iterator it =
    this->UniqueObjectNamesMap.find(sin);

  // If no entry exists create one.
  if (it == this->UniqueObjectNamesMap.end()) {
    // Start with the original name.
    std::string ssin = sin;

    // Avoid full paths by removing leading slashes.
    ssin.erase(0, ssin.find_first_not_of('/'));

    // Avoid full paths by removing colons.
    std::replace(ssin.begin(), ssin.end(), ':', '_');

    // Avoid relative paths that go up the tree.
    cmSystemTools::ReplaceString(ssin, "../", "__/");

    // Avoid spaces.
    std::replace(ssin.begin(), ssin.end(), ' ', '_');

    // Mangle the name if necessary.
    if (this->Makefile->IsOn("CMAKE_MANGLE_OBJECT_FILE_NAMES")) {
      bool done;
      int cc = 0;
      char rpstr[100];
      sprintf(rpstr, "_p_");
      cmSystemTools::ReplaceString(ssin, "+", rpstr);
      std::string sssin = sin;
      do {
        done = true;
        for (it = this->UniqueObjectNamesMap.begin();
             it != this->UniqueObjectNamesMap.end(); ++it) {
          if (it->second == ssin) {
            done = false;
          }
        }
        if (done) {
          break;
        }
        sssin = ssin;
        cmSystemTools::ReplaceString(ssin, "_p_", rpstr);
        sprintf(rpstr, "_p%d_", cc++);
      } while (!done);
    }

#if defined(CM_LG_ENCODE_OBJECT_NAMES)
    if (!cmLocalGeneratorCheckObjectName(ssin, dir_max.size(),
                                         this->ObjectPathMax)) {
      // Warn if this is the first time the path has been seen.
      if (this->ObjectMaxPathViolations.insert(dir_max).second) {
        std::ostringstream m;
        /* clang-format off */
        m << "The object file directory\n"
          << "  " << dir_max << "\n"
          << "has " << dir_max.size() << " characters.  "
          << "The maximum full path to an object file is "
          << this->ObjectPathMax << " characters "
          << "(see CMAKE_OBJECT_PATH_MAX).  "
          << "Object file\n"
          << "  " << ssin << "\n"
          << "cannot be safely placed under this directory.  "
          << "The build may not work correctly.";
        /* clang-format on */
        this->IssueMessage(cmake::WARNING, m.str());
      }
    }
#else
    (void)dir_max;
#endif

    // Insert the newly mapped object file name.
    std::map<std::string, std::string>::value_type e(sin, ssin);
    it = this->UniqueObjectNamesMap.insert(e).first;
  }

  // Return the map entry.
  return it->second;
}